

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

LocalGet * __thiscall MixedArena::alloc<wasm::LocalGet>(MixedArena *this)

{
  LocalGet *pLVar1;
  
  pLVar1 = (LocalGet *)allocSpace(this,0x18,8);
  (pLVar1->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression._id = LocalGetId;
  (pLVar1->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = 0;
  return pLVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }